

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

LatticeComparison __thiscall
wasm::analysis::Vector<wasm::RandomLattice>::compare
          (Vector<wasm::RandomLattice> *this,Element *a,Element *b)

{
  uint __line;
  LatticeComparison LVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  char *__assertion;
  LatticeComparison LVar5;
  bool bVar6;
  
  lVar3 = (long)(a->
                super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = lVar3 >> 4;
  if (uVar2 == this->size) {
    if ((long)(b->
              super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
              )._M_impl.super__Vector_impl_data._M_start == lVar3) {
      LVar5 = EQUAL;
      lVar3 = 0;
      uVar4 = 0;
      do {
        if (uVar2 <= uVar4) {
          return LVar5;
        }
        LVar1 = RandomLattice::compare
                          (&this->lattice,
                           (Element *)
                           ((long)&(((a->
                                     super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                   super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar3),
                           (Element *)
                           ((long)&(((b->
                                     super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                   super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar3));
        if (LVar1 == LESS) {
          bVar6 = LVar5 == GREATER;
          LVar5 = LESS;
LAB_001b426d:
          if (bVar6) {
            return NO_RELATION;
          }
        }
        else {
          if (LVar1 == GREATER) {
            bVar6 = LVar5 == LESS;
            LVar5 = GREATER;
            goto LAB_001b426d;
          }
          if (LVar1 == NO_RELATION) {
            return NO_RELATION;
          }
        }
        uVar4 = uVar4 + 1;
        uVar2 = this->size;
        lVar3 = lVar3 + 0x10;
      } while( true );
    }
    __assertion = "b.size() == size";
    __line = 0x37;
  }
  else {
    __assertion = "a.size() == size";
    __line = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,__line,
                "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
               );
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    assert(a.size() == size);
    assert(b.size() == size);
    auto result = EQUAL;
    for (size_t i = 0; i < size; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }